

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_left_predictor_32x8_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ulong uVar6;
  uint5 uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  int iVar10;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  
  uVar1 = *(uint *)left;
  auVar2[0xc] = (char)(uVar1 >> 0x18);
  auVar2._0_12_ = ZEXT712(0);
  uVar7 = CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar1 >> 0x10));
  auVar9._5_8_ = 0;
  auVar9._0_5_ = uVar7;
  uVar12 = *(undefined4 *)(left + 4);
  uVar6 = (ulong)(ushort)uVar12 & 0xffffffffffff00ff;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar6;
  auVar3[0xc] = (char)((uint)uVar12 >> 0x18);
  auVar4[8] = (char)((uint)uVar12 >> 0x10);
  auVar4._0_8_ = uVar6;
  auVar4[9] = 0;
  auVar4._10_3_ = auVar3._10_3_;
  auVar8._5_8_ = 0;
  auVar8._0_5_ = auVar4._8_5_;
  auVar5[4] = (char)((uint)uVar12 >> 8);
  auVar5._0_4_ = (int)uVar6;
  auVar5[5] = 0;
  auVar5._6_7_ = SUB137(auVar8 << 0x40,6);
  iVar10 = 8;
  uVar11 = (undefined1)
           ((uint)(uint3)(auVar3._10_3_ >> 0x10) + (uint)(uint3)(auVar2._10_3_ >> 0x10) +
            auVar5._4_4_ + (int)CONCAT72(SUB137(auVar9 << 0x40,6),(ushort)(byte)(uVar1 >> 8)) +
            auVar4._8_4_ + (int)uVar7 + (int)uVar6 + (uVar1 & 0xff) + 4 >> 3);
  auVar13 = ZEXT216(CONCAT11(uVar11,uVar11));
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar12 = auVar13._0_4_;
  do {
    *(undefined4 *)(dst + 0x10) = uVar12;
    *(undefined4 *)(dst + 0x14) = uVar12;
    *(undefined4 *)(dst + 0x18) = uVar12;
    *(undefined4 *)(dst + 0x1c) = uVar12;
    *(undefined4 *)dst = uVar12;
    *(undefined4 *)(dst + 4) = uVar12;
    *(undefined4 *)(dst + 8) = uVar12;
    *(undefined4 *)(dst + 0xc) = uVar12;
    dst = dst + stride;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

static inline void dc_left_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)above;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}